

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

char * signalForMember(char *member)

{
  int iVar1;
  char cVar2;
  int *piVar3;
  int i;
  char *pcVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::normalizedSignature((char *)&local_48);
  piVar3 = (int *)&DAT_0066c200;
  pcVar5 = "2textValueSelected(QString)";
  while( true ) {
    pcVar4 = local_48.ptr;
    if (local_48.ptr == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    cVar2 = FUN_002b3980(pcVar5,pcVar4);
    if (cVar2 != '\0') break;
    piVar3 = piVar3 + 1;
    pcVar5 = "2intValueSelected(int)";
  }
  iVar1 = *piVar3;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return &DAT_0066c200 + iVar1;
}

Assistant:

static const char *signalForMember(const char *member)
{
    QByteArray normalizedMember(QMetaObject::normalizedSignature(member));

    for (int i = 0; i < NumCandidateSignals; ++i)
        if (QMetaObject::checkConnectArgs(candidateSignal(i), normalizedMember))
            return candidateSignal(i);

    // otherwise, use fit-all accepted signal:
    return SIGNAL(accepted());
}